

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_uint mz_zip_reader_get_filename
                  (mz_zip_archive *pZip,mz_uint file_index,char *pFilename,mz_uint filename_buf_size
                  )

{
  int in_ECX;
  undefined1 *in_RDX;
  uint in_ESI;
  long in_RDI;
  mz_uint8 *p;
  mz_uint n;
  uint local_44;
  mz_uint local_18;
  size_t local_8;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) || (*(uint *)(in_RDI + 0x10) <= in_ESI))
     || (*(int *)(in_RDI + 0x14) != 1)) {
    local_8 = 0;
  }
  else {
    local_8 = **(long **)(in_RDI + 0x58) +
              (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x58) + 0x20) + (ulong)in_ESI * 4);
  }
  if (local_8 == 0) {
    if (in_ECX != 0) {
      *in_RDX = 0;
    }
    local_18 = 0;
  }
  else {
    local_44 = (uint)*(ushort *)(local_8 + 0x1c);
    if (in_ECX != 0) {
      if (in_ECX - 1U <= local_44) {
        local_44 = in_ECX - 1;
      }
      __wrap_memcpy(in_RDX,(void *)CONCAT44(in_ECX,local_44),local_8);
      in_RDX[local_44] = 0;
    }
    local_18 = local_44 + 1;
  }
  return local_18;
}

Assistant:

mz_uint mz_zip_reader_get_filename(mz_zip_archive *pZip, mz_uint file_index, char *pFilename, mz_uint filename_buf_size)
{
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if (!p) { if (filename_buf_size) pFilename[0] = '\0'; return 0; }
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  if (filename_buf_size)
  {
    n = MZ_MIN(n, filename_buf_size - 1);
    memcpy(pFilename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
    pFilename[n] = '\0';
  }
  return n + 1;
}